

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O1

bool duckdb::TrySimpleIntegerCast<unsigned_int,false>(char *buf,idx_t len,uint *result,bool strict)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  undefined7 in_register_00000009;
  undefined8 uVar4;
  idx_t iVar5;
  int iVar6;
  char cVar7;
  uint uVar8;
  char *pcVar9;
  byte bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  IntegerCastData<short> local_5a;
  IntegerDecimalCastData<unsigned_int> local_58;
  undefined8 local_40;
  ulong local_38;
  
  uVar4 = CONCAT71(in_register_00000009,strict);
  uVar8 = (uint)uVar4;
  if (len != 0) {
    uVar12 = 0;
    do {
      bVar1 = buf[uVar12];
      uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),bVar1);
      uVar8 = (uint)uVar4;
      uVar15 = (uint)bVar1;
      if ((4 < uVar15 - 9) && (uVar15 != 0x20)) {
        if (uVar15 == 0x2d) {
          uVar16 = len - uVar12;
          uVar13 = 1;
          goto LAB_00cebd2c;
        }
        if (bVar1 != 0x30 || len - 1 == uVar12) {
LAB_00cebef0:
          local_40 = (uint *)CONCAT44(local_40._4_4_,3);
          uVar16 = len - uVar12;
          local_38 = (ulong)(bVar1 == 0x2b);
          uVar8 = 0;
          uVar13 = local_38;
          goto LAB_00cebf0f;
        }
        cVar7 = buf[uVar12 + 1];
        if (cVar7 != 'B') {
          if (cVar7 != 'x') {
            if (cVar7 == 'b') goto LAB_00cec1e5;
            if (cVar7 != 'X') goto LAB_00cebef0;
          }
          uVar8 = 0;
          uVar13 = 1;
          goto LAB_00cebded;
        }
LAB_00cec1e5:
        uVar13 = ~uVar12 + len;
        uVar8 = 0;
        bVar19 = uVar13 >= 2;
        if (uVar13 < 2) goto LAB_00cebd4d;
        uVar16 = 1;
        uVar8 = 0;
        goto LAB_00cec201;
      }
      uVar12 = uVar12 + 1;
    } while (len != uVar12);
  }
  bVar19 = false;
  goto LAB_00cebd4d;
  while (lVar2 = uVar12 + uVar13, uVar13 = uVar13 + 1, buf[lVar2] == '0') {
LAB_00cebd2c:
    if (uVar16 <= uVar13) {
      uVar13 = 1;
      uVar8 = 0;
      bVar19 = false;
      goto LAB_00cebff6;
    }
  }
  uVar8 = 0;
LAB_00cebd45:
  bVar19 = false;
  goto LAB_00cebd4d;
  while( true ) {
    bVar18 = true;
    uVar11 = uVar13 + 1;
    if ((~uVar13 + len != uVar12) && (buf[uVar12 + 1 + uVar13] == '_')) {
      uVar11 = uVar13 + 2;
      if ((len - uVar13) - 2 == uVar12) {
        bVar18 = false;
      }
      else {
        bVar18 = (byte)(buf[uVar12 + uVar11] - 0x30U) < 10;
      }
    }
    uVar13 = uVar11;
    uVar8 = uVar8 * 10 - (uint)bVar1;
    if (!bVar18) break;
LAB_00cebff6:
    if (uVar16 <= uVar13) goto LAB_00cec7ed;
    bVar1 = buf[uVar12 + uVar13] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar12 + uVar13] == '.') {
        uVar11 = uVar13 + 1;
        if (uVar11 < uVar16) {
          iVar14 = 0;
          if (9 < (byte)(buf[uVar12 + 1 + uVar13] - 0x30U)) goto LAB_00cec781;
          iVar6 = 1;
        }
        else {
          iVar14 = 3;
LAB_00cec781:
          iVar6 = 1;
          if (1 < uVar13) {
            iVar6 = iVar14;
          }
        }
        uVar13 = uVar11;
        if (iVar6 == 3) goto LAB_00cec7ed;
        if (iVar6 != 0) goto LAB_00cebd45;
      }
      bVar19 = false;
      if (((ulong)(byte)buf[uVar12 + uVar13] < 0x21) &&
         (bVar19 = false, (0x100003e00U >> ((ulong)(byte)buf[uVar12 + uVar13] & 0x3f) & 1) != 0)) {
        uVar11 = uVar13 + 1;
        uVar13 = uVar11;
        if (uVar16 <= uVar11) goto LAB_00cec7ed;
        goto LAB_00cec7c1;
      }
      break;
    }
  }
  goto LAB_00cebd4d;
  while (uVar11 = uVar11 + 1, uVar13 = uVar16, uVar16 != uVar11) {
LAB_00cec7c1:
    if ((0x20 < (ulong)(byte)buf[uVar12 + uVar11]) ||
       ((0x100003e00U >> ((ulong)(byte)buf[uVar12 + uVar11] & 0x3f) & 1) == 0)) goto LAB_00cebd45;
  }
LAB_00cec7ed:
  bVar19 = 1 < uVar13;
  goto LAB_00cebd4d;
  while( true ) {
    uVar11 = uVar13 + 1;
    bVar18 = false;
    if (uVar8 <= ~(uint)bVar1 / 10) {
      uVar8 = uVar8 * 10 + (uint)bVar1;
      bVar18 = true;
      if ((~uVar13 + len != uVar12) && (buf[uVar12 + 1 + uVar13] == '_')) {
        uVar11 = uVar13 + 2;
        if ((len - uVar13) - 2 == uVar12) {
          bVar18 = false;
        }
        else {
          bVar18 = (byte)(buf[uVar12 + uVar11] - 0x30U) < 10;
        }
      }
    }
    bVar19 = false;
    uVar13 = uVar11;
    if (!bVar18) break;
LAB_00cebf0f:
    if (uVar16 <= uVar13) goto LAB_00cec4e4;
    bVar1 = buf[uVar12 + uVar13] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar12 + uVar13] == '.') {
        uVar11 = uVar13 + 1;
        if ((uVar11 < uVar16) &&
           (local_40 = (uint *)((ulong)local_40._4_4_ << 0x20),
           (byte)(buf[uVar12 + 1 + uVar13] - 0x30U) < 10)) {
          iVar14 = 1;
        }
        else {
          iVar14 = 1;
          if (local_38 < uVar13) {
            iVar14 = (int)local_40;
          }
        }
        uVar13 = uVar11;
        if (iVar14 == 3) goto LAB_00cec4e4;
        if (iVar14 != 0) goto LAB_00cebd45;
      }
      bVar19 = false;
      if (((ulong)(byte)buf[uVar12 + uVar13] < 0x21) &&
         ((0x100003e00U >> ((ulong)(byte)buf[uVar12 + uVar13] & 0x3f) & 1) != 0)) {
        uVar11 = uVar13 + 1;
        uVar13 = uVar11;
        if (uVar16 <= uVar11) goto LAB_00cec4e4;
        goto LAB_00cec4bc;
      }
      break;
    }
  }
  goto LAB_00cebd4d;
  while (uVar11 = uVar11 + 1, uVar13 = uVar16, uVar16 != uVar11) {
LAB_00cec4bc:
    if ((0x20 < (ulong)(byte)buf[uVar12 + uVar11]) ||
       ((0x100003e00U >> ((ulong)(byte)buf[uVar12 + uVar11] & 0x3f) & 1) == 0)) goto LAB_00cebd45;
  }
LAB_00cec4e4:
  bVar19 = local_38 < uVar13;
  goto LAB_00cebd4d;
LAB_00cebded:
  do {
    if (~uVar12 + len <= uVar13) goto LAB_00cec7ed;
    bVar1 = buf[uVar12 + 1 + uVar13];
    bVar10 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar10 = bVar1;
    }
    if (9 < (byte)(bVar10 - 0x30)) {
      bVar19 = false;
      if ((0x25 < bVar10 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar10 - 0x41) & 0x3f) & 1) == 0))
      break;
    }
    cVar7 = -0x57;
    if ((char)bVar10 < 'a') {
      cVar7 = -0x30;
    }
    uVar16 = uVar13 + 1;
    if (((len - uVar13) - 2 == uVar12) || (buf[uVar12 + 2 + uVar13] != '_')) {
LAB_00cebebb:
      bVar18 = uVar8 <= ~(uint)(byte)(cVar7 + bVar10) >> 4;
      if (bVar18) {
        uVar8 = uVar8 * 0x10 + (uint)(byte)(cVar7 + bVar10);
      }
    }
    else {
      uVar16 = uVar13 + 2;
      if ((len - uVar13) - 3 != uVar12) {
        if (9 < (byte)(buf[uVar12 + 3 + uVar13] - 0x30U)) {
          uVar15 = (byte)buf[uVar12 + 3 + uVar13] - 0x41;
          bVar18 = false;
          if ((0x25 < uVar15) ||
             (bVar18 = false, (0x3f0000003fU >> ((ulong)uVar15 & 0x3f) & 1) == 0))
          goto LAB_00cebedf;
        }
        goto LAB_00cebebb;
      }
      bVar18 = false;
    }
LAB_00cebedf:
    bVar19 = false;
    uVar13 = uVar16;
  } while (bVar18);
  goto LAB_00cebd4d;
  while (lVar2 = uVar12 + uVar16, uVar16 = uVar16 + 1, buf[lVar2] == '0') {
LAB_00cebfd2:
    if (uVar13 <= uVar16) {
      local_58.result = 0;
      uVar16 = 1;
      goto LAB_00cec3b6;
    }
  }
  goto LAB_00cebd83;
  while( true ) {
    bVar1 = buf[uVar12 + uVar16] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar12 + uVar16] != '.') goto LAB_00cec958;
      uVar11 = uVar16 + 1;
      if (uVar13 <= uVar11) {
        iVar14 = 3;
        uVar17 = uVar11;
        goto LAB_00cec934;
      }
      local_58.decimal = 0;
      uVar3 = uVar11;
      goto LAB_00cec6e3;
    }
    uVar11 = uVar16 + 1;
    if (local_58.result < (long)((ulong)bVar1 + 0x8000000000000000) / 10) {
      bVar19 = false;
    }
    else {
      local_58.result = local_58.result * 10 - (ulong)bVar1;
      bVar19 = true;
      if ((~uVar16 + len != uVar12) && (bVar19 = true, buf[uVar12 + 1 + uVar16] == '_')) {
        uVar11 = uVar16 + 2;
        if ((len - uVar16) - 2 == uVar12) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(buf[uVar12 + uVar11] - 0x30U) < 10;
        }
      }
    }
    uVar16 = uVar11;
    if (!bVar19) break;
LAB_00cec3b6:
    if (uVar13 <= uVar16) goto LAB_00cec699;
  }
  goto LAB_00cebd81;
  while (uVar3 = uVar17, uVar17 < uVar13) {
LAB_00cec6e3:
    bVar1 = buf[uVar12 + uVar3] - 0x30;
    if (9 < bVar1) {
      iVar14 = 0;
      goto LAB_00cec925;
    }
    if (local_58.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_58.decimal_digits = local_58.decimal_digits + 1;
      local_58.decimal = local_58.decimal * 10 + (ulong)bVar1;
    }
    uVar17 = uVar3 + 1;
    if (((~uVar3 + len != uVar12) && (buf[uVar12 + 1 + uVar3] == '_')) &&
       ((uVar17 = uVar3 + 2, (len - uVar3) - 2 == uVar12 ||
        (9 < (byte)(buf[uVar12 + uVar17] - 0x30U))))) {
      local_58._18_6_ = 0;
      iVar6 = 1;
      local_40 = result;
      goto LAB_00cec947;
    }
  }
  iVar14 = 3;
LAB_00cec925:
  local_58._18_6_ = 0;
  uVar17 = uVar3;
  local_40 = result;
LAB_00cec934:
  iVar6 = 1;
  if (uVar11 < uVar17) {
    iVar6 = iVar14;
  }
  if (1 < uVar16) {
    iVar6 = iVar14;
  }
LAB_00cec947:
  uVar16 = uVar17;
  if (iVar6 == 3) {
LAB_00cec699:
    bVar19 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,true>(&local_58);
    if (bVar19) {
      bVar19 = 1 < uVar16;
      goto LAB_00cebd83;
    }
  }
  else if (iVar6 == 0) {
LAB_00cec958:
    bVar1 = buf[uVar12 + uVar16];
    if (bVar1 - 9 < 5) {
LAB_00cec96a:
      uVar11 = uVar16 + 1;
      uVar16 = uVar11;
      if (uVar11 < uVar13) {
        do {
          if ((0x20 < (ulong)(byte)buf[uVar12 + uVar11]) ||
             ((0x100003e00U >> ((ulong)(byte)buf[uVar12 + uVar11] & 0x3f) & 1) == 0))
          goto LAB_00cebd81;
          uVar11 = uVar11 + 1;
          uVar16 = uVar13;
        } while (uVar13 != uVar11);
      }
      goto LAB_00cec699;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar16 != 1) && (uVar16 + 1 < uVar13)) {
        local_5a.result = 0;
        pcVar9 = buf + uVar12 + uVar16 + 1;
        iVar5 = ~uVar12 + (len - uVar16);
        if (*pcVar9 == '-') {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar9,iVar5,&local_5a,SUB81(iVar5,0));
        }
        else {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar9,iVar5,&local_5a,SUB81(iVar5,0));
        }
        if (bVar19 != false) {
          bVar19 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_int>,true>
                             (&local_58,local_5a.result);
          goto LAB_00cebd83;
        }
      }
    }
    else if (bVar1 == 0x20) goto LAB_00cec96a;
  }
  goto LAB_00cebd81;
  while( true ) {
    bVar1 = buf[uVar12 + uVar16] - 0x30;
    if (9 < bVar1) {
      if (buf[uVar12 + uVar16] != '.') goto LAB_00cec877;
      uVar11 = uVar16 + 1;
      if (uVar13 <= uVar11) {
        iVar14 = 3;
        uVar17 = uVar11;
        goto LAB_00cec852;
      }
      local_58.decimal = 0;
      uVar3 = uVar11;
      goto LAB_00cec5ff;
    }
    uVar11 = uVar16 + 1;
    bVar19 = false;
    if (local_58.result <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_58.result = local_58.result * 10 + (ulong)bVar1;
      bVar19 = true;
      if ((~uVar16 + len != uVar12) && (buf[uVar12 + 1 + uVar16] == '_')) {
        uVar11 = uVar16 + 2;
        if ((len - uVar16) - 2 == uVar12) {
          bVar19 = false;
        }
        else {
          bVar19 = (byte)(buf[uVar12 + uVar11] - 0x30U) < 10;
        }
      }
    }
    uVar16 = uVar11;
    if (!bVar19) break;
LAB_00cec2d4:
    if (uVar13 <= uVar16) goto LAB_00cec4f8;
  }
  goto LAB_00cebd81;
  while (uVar3 = uVar17, uVar17 < uVar13) {
LAB_00cec5ff:
    bVar1 = buf[uVar12 + uVar3] - 0x30;
    if (9 < bVar1) {
      iVar14 = 0;
      goto LAB_00cec842;
    }
    if (local_58.decimal <= (long)(((ulong)bVar1 ^ 0x7ffffffffffffffe) / 10)) {
      local_58.decimal_digits = local_58.decimal_digits + 1;
      local_58.decimal = local_58.decimal * 10 + (ulong)bVar1;
    }
    uVar17 = uVar3 + 1;
    if (((~uVar3 + len != uVar12) && (buf[uVar12 + 1 + uVar3] == '_')) &&
       ((uVar17 = uVar3 + 2, (len - uVar3) - 2 == uVar12 ||
        (9 < (byte)(buf[uVar12 + uVar17] - 0x30U))))) {
      local_58._18_6_ = 0;
      iVar6 = 1;
      local_40 = result;
      goto LAB_00cec866;
    }
  }
  iVar14 = 3;
LAB_00cec842:
  local_58._18_6_ = 0;
  uVar17 = uVar3;
  local_40 = result;
LAB_00cec852:
  iVar6 = 1;
  if (uVar11 < uVar17) {
    iVar6 = iVar14;
  }
  if (local_38 < uVar16) {
    iVar6 = iVar14;
  }
LAB_00cec866:
  uVar16 = uVar17;
  if (iVar6 == 3) {
LAB_00cec4f8:
    bVar19 = IntegerDecimalCastOperation::
             Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>(&local_58);
    if (bVar19) {
      bVar19 = local_38 < uVar16;
      goto LAB_00cebd83;
    }
  }
  else if (iVar6 == 0) {
LAB_00cec877:
    bVar1 = buf[uVar12 + uVar16];
    if (bVar1 - 9 < 5) {
LAB_00cec889:
      uVar11 = uVar16 + 1;
      uVar16 = uVar11;
      if (uVar11 < uVar13) {
        do {
          if ((0x20 < (ulong)(byte)buf[uVar12 + uVar11]) ||
             ((0x100003e00U >> ((ulong)(byte)buf[uVar12 + uVar11] & 0x3f) & 1) == 0))
          goto LAB_00cebd81;
          uVar11 = uVar11 + 1;
          uVar16 = uVar13;
        } while (uVar13 != uVar11);
      }
      goto LAB_00cec4f8;
    }
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      if ((uVar16 != local_38) && (uVar16 + 1 < uVar13)) {
        local_5a.result = 0;
        pcVar9 = buf + uVar12 + uVar16 + 1;
        iVar5 = ~uVar12 + (len - uVar16);
        if (*pcVar9 == '-') {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar9,iVar5,&local_5a,SUB81(iVar5,0));
        }
        else {
          bVar19 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                             (pcVar9,iVar5,&local_5a,SUB81(iVar5,0));
        }
        if (bVar19 != false) {
          bVar19 = IntegerDecimalCastOperation::
                   HandleExponent<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                             (&local_58,local_5a.result);
          goto LAB_00cebd83;
        }
      }
    }
    else if (bVar1 == 0x20) goto LAB_00cec889;
  }
  goto LAB_00cebd81;
LAB_00cec0d1:
  do {
    if (~uVar12 + len <= uVar13) {
      bVar19 = IntegerDecimalCastOperation::
               Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>(&local_58);
      bVar19 = 1 < uVar13 && bVar19;
      goto LAB_00cebd83;
    }
    bVar1 = buf[uVar12 + 1 + uVar13];
    bVar10 = bVar1 | 0x20;
    if (0x19 < (byte)(bVar1 + 0xbf)) {
      bVar10 = bVar1;
    }
    if ((9 < (byte)(bVar10 - 0x30)) &&
       ((0x25 < bVar10 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar10 - 0x41) & 0x3f) & 1) == 0))))
    break;
    cVar7 = -0x57;
    if ((char)bVar10 < 'a') {
      cVar7 = -0x30;
    }
    uVar16 = uVar13 + 1;
    if (((len - uVar13) - 2 == uVar12) || (buf[uVar12 + 2 + uVar13] != '_')) {
LAB_00cec19e:
      uVar13 = (ulong)((byte)(cVar7 + bVar10) >> 4) ^ 0x7ffffffffffffff;
      lVar2 = local_58.result;
      if (local_58.result <= (long)uVar13) {
        lVar2 = local_58.result * 0x10 + (ulong)(byte)(cVar7 + bVar10);
      }
      bVar19 = local_58.result <= (long)uVar13;
      local_58.result = lVar2;
    }
    else {
      uVar16 = uVar13 + 2;
      if ((len - uVar13) - 3 != uVar12) {
        if (9 < (byte)(buf[uVar12 + 3 + uVar13] - 0x30U)) {
          uVar8 = (byte)buf[uVar12 + 3 + uVar13] - 0x41;
          bVar19 = false;
          if ((0x25 < uVar8) || (bVar19 = false, (0x3f0000003fU >> ((ulong)uVar8 & 0x3f) & 1) == 0))
          goto LAB_00cec1c5;
        }
        goto LAB_00cec19e;
      }
      bVar19 = false;
    }
LAB_00cec1c5:
    uVar13 = uVar16;
  } while (bVar19);
  goto LAB_00cebd81;
  while( true ) {
    uVar16 = uVar3;
    if (0x3fffffffffffffff < local_58.result) goto LAB_00cebd81;
    local_58.result = uVar11 + local_58.result * 2;
    if (uVar13 <= uVar16) break;
LAB_00cec540:
    if (buf[uVar12 + 1 + uVar16] == '0') {
      uVar11 = 0;
    }
    else {
      uVar11 = 1;
      if (buf[uVar12 + 1 + uVar16] != '1') goto LAB_00cebd81;
    }
    uVar3 = uVar16 + 1;
    if (((len - uVar16) - 2 != uVar12) && (buf[uVar12 + 2 + uVar16] == '_')) {
      if (((len - uVar16) - 3 == uVar12) || ((buf[uVar12 + 3 + uVar16] & 0xfeU) != 0x30))
      goto LAB_00cebd81;
      uVar3 = uVar16 + 2;
    }
  }
LAB_00cec5ba:
  bVar19 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_int>,false>
                     (&local_58);
  bVar19 = bVar19 && 1 < uVar13;
  goto LAB_00cebd83;
  while( true ) {
    uVar11 = uVar16 + 1;
    if (((len - uVar16) - 2 != uVar12) && (buf[uVar12 + 2 + uVar16] == '_')) {
      if (((len - uVar16) - 3 == uVar12) || ((buf[uVar12 + 3 + uVar16] & 0xfeU) != 0x30))
      goto LAB_00cebd45;
      uVar11 = uVar16 + 2;
    }
    uVar16 = uVar11;
    if ((int)uVar8 < 0) goto LAB_00cebd45;
    uVar8 = iVar14 + uVar8 * 2;
    bVar19 = true;
    if (uVar13 <= uVar16) break;
LAB_00cec201:
    iVar14 = 0;
    if (buf[uVar12 + 1 + uVar16] != '0') {
      if (buf[uVar12 + 1 + uVar16] != '1') goto LAB_00cebd45;
      iVar14 = 1;
    }
  }
LAB_00cebd4d:
  if (bVar19) {
    *result = uVar8;
    bVar19 = true;
  }
  else {
    if (len != 0) {
      uVar12 = 0;
      do {
        bVar1 = buf[uVar12];
        if ((0x20 < (ulong)bVar1) || ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
          local_58.result = 0;
          local_58.decimal = 0;
          local_58._16_8_ = 0;
          uVar13 = len - uVar12;
          local_58.decimal_digits = 0;
          if (bVar1 == 0x2d) {
            bVar19 = false;
            uVar16 = 1;
            goto LAB_00cebfd2;
          }
          if (bVar1 != 0x30 || len - 1 == uVar12) {
LAB_00cec2c1:
            local_38 = (ulong)(bVar1 == 0x2b);
            local_58.result = 0;
            uVar16 = local_38;
            goto LAB_00cec2d4;
          }
          cVar7 = buf[uVar12 + 1];
          if (cVar7 != 'B') {
            if (cVar7 != 'x') {
              if (cVar7 == 'b') goto LAB_00cec517;
              if (cVar7 != 'X') goto LAB_00cec2c1;
            }
            local_58.result = 0;
            uVar13 = 1;
            goto LAB_00cec0d1;
          }
LAB_00cec517:
          uVar13 = ~uVar12 + len;
          if (uVar13 < 2) goto LAB_00cec5ba;
          local_58.result = 0;
          uVar16 = 1;
          goto LAB_00cec540;
        }
        uVar12 = uVar12 + 1;
      } while (len != uVar12);
    }
LAB_00cebd81:
    bVar19 = false;
LAB_00cebd83:
    if (bVar19 != false) {
      *result = (uint)local_58.result;
    }
  }
  return bVar19;
}

Assistant:

static inline bool TrySimpleIntegerCast(const char *buf, idx_t len, T &result, bool strict) {
	IntegerCastData<T> simple_data;
	if (TryIntegerCast<IntegerCastData<T>, IS_SIGNED, false, IntegerCastOperation>(buf, len, simple_data, strict)) {
		result = (T)simple_data.result;
		return true;
	}

	// Simple integer cast failed, try again with decimals/exponents included
	// FIXME: This could definitely be improved as some extra work is being done here. It is more important that
	//  "normal" integers (without exponent/decimals) are still being parsed quickly.
	IntegerDecimalCastData<T> cast_data;
	if (TryIntegerCast<IntegerDecimalCastData<T>, IS_SIGNED, true, IntegerDecimalCastOperation>(buf, len, cast_data,
	                                                                                            strict)) {
		result = (T)cast_data.result;
		return true;
	}
	return false;
}